

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzer.cpp
# Opt level: O0

void __thiscall MDIOAnalyzer::ProcessOpcodeFrame(MDIOAnalyzer *this)

{
  element_type *peVar1;
  long local_68;
  Frame frame;
  undefined8 local_30;
  U64 value;
  DataBuilder opcode;
  BitState local_1c;
  BitState bit1;
  BitState bit0;
  U64 starting_sample;
  MDIOAnalyzer *this_local;
  
  starting_sample = (U64)this;
  _bit1 = AnalyzerChannelData::GetSampleNumber();
  _bit1 = _bit1 + 1;
  GetBit(this,&local_1c,&this->mMdcPosedgeArrows);
  GetBit(this,(BitState *)&opcode,&this->mMdcPosedgeArrows);
  DataBuilder::DataBuilder((DataBuilder *)&value);
  local_30 = 0;
  DataBuilder::Reset((ulonglong *)&value,(ShiftOrder)&local_30,0);
  DataBuilder::AddBit((BitState)&value);
  DataBuilder::AddBit((BitState)&value);
  Frame::Frame((Frame *)&local_68);
  if ((this->mCurrentPacket).clause == MDIO_C22_PACKET) {
    switch(local_30) {
    case 0:
      (this->mCurrentPacket).operation = MDIO_PACKET_WRITE;
      break;
    case 1:
      (this->mCurrentPacket).operation = MDIO_PACKET_WRITE;
      break;
    case 2:
      (this->mCurrentPacket).operation = MDIO_PACKET_READ;
      break;
    case 3:
      (this->mCurrentPacket).operation = MDIO_PACKET_READ;
      break;
    default:
    }
  }
  else {
    (this->mCurrentPacket).c45Type = MDIO_C45_PACKET_DATA;
    (this->mCurrentPacket).operation = MDIO_PACKET_WRITE;
    switch(local_30) {
    case 0:
      (this->mCurrentPacket).c45Type = MDIO_C45_PACKET_ADDR;
      (this->mCurrentPacket).operation = MDIO_PACKET_WRITE;
      break;
    case 1:
      (this->mCurrentPacket).operation = MDIO_PACKET_WRITE;
      break;
    case 2:
      (this->mCurrentPacket).operation = MDIO_PACKET_READ;
      break;
    case 3:
      (this->mCurrentPacket).operation = MDIO_PACKET_READ;
      break;
    default:
    }
  }
  local_68 = _bit1;
  _frame = AnalyzerChannelData::GetSampleNumber();
  peVar1 = std::auto_ptr<MDIOAnalyzerResults>::operator->(&this->mResults);
  AnalyzerResults::AddFrame((Frame *)peVar1);
  Analyzer::ReportProgress((ulonglong)this);
  Frame::~Frame((Frame *)&local_68);
  DataBuilder::~DataBuilder((DataBuilder *)&value);
  return;
}

Assistant:

void MDIOAnalyzer::ProcessOpcodeFrame()
{
    // starting sample of the start frame
    U64 starting_sample = mMdio->GetSampleNumber() + 1;

    // get the value of the two bits of the start frame
    BitState bit0, bit1;
    GetBit( bit0, mMdcPosedgeArrows ); // sample first bit
    GetBit( bit1, mMdcPosedgeArrows ); // sample second bit

    // reconstruct the opcode
    DataBuilder opcode;
    U64 value = 0;
    opcode.Reset( &value, AnalyzerEnums::MsbFirst, 2 );
    opcode.AddBit( bit0 );
    opcode.AddBit( bit1 );

    // create and set the opcode frame
    Frame frame;

    if( mCurrentPacket.clause == MDIO_C22_PACKET )
    {
        switch( value )
        {
        case C45_ADDRESS:
            frame.mType = MDIO_UNKNOWN; // Clause 22 opcode cannot be C45_ADDRESS (00)
            mCurrentPacket.operation = MDIO_PACKET_WRITE;
            break;
        case C22_WRITE:
            frame.mType = MDIO_OP_W;
            mCurrentPacket.operation = MDIO_PACKET_WRITE;
            break;
        case C22_READ:
            frame.mType = MDIO_OP_R;
            mCurrentPacket.operation = MDIO_PACKET_READ;
            break;
        case C45_READ:
            frame.mType = MDIO_UNKNOWN; // Clause 22 opcode cannot be C45_READ (11)
            mCurrentPacket.operation = MDIO_PACKET_READ;
            break;
        default:
            frame.mType = MDIO_UNKNOWN;
        }
    }
    else // mCurrentPacket.clause == MDIO_C45_PACKET
    {
        mCurrentPacket.c45Type = MDIO_C45_PACKET_DATA;
        mCurrentPacket.operation = MDIO_PACKET_WRITE;

        switch( value )
        {
        case C45_ADDRESS:
            frame.mType = MDIO_C45_OP_ADDR;
            mCurrentPacket.c45Type = MDIO_C45_PACKET_ADDR;
            mCurrentPacket.operation = MDIO_PACKET_WRITE;
            break;
        case C45_WRITE:
            frame.mType = MDIO_OP_W;
            mCurrentPacket.operation = MDIO_PACKET_WRITE;
            break;
        case C45_READ_AND_ADDR:
            frame.mType = MDIO_C45_OP_READ_INC_ADDR;
            mCurrentPacket.operation = MDIO_PACKET_READ;
            break;
        case C45_READ:
            frame.mType = MDIO_OP_R;
            mCurrentPacket.operation = MDIO_PACKET_READ;
            break;
        default:
            frame.mType = MDIO_UNKNOWN;
        }
    }

    if( frame.mType == MDIO_UNKNOWN )
    {
        frame.mFlags = DISPLAY_AS_ERROR_FLAG;
    }
    else
    {
        frame.mFlags = 0;
    }

    frame.mStartingSampleInclusive = starting_sample;
    frame.mEndingSampleInclusive = mMdio->GetSampleNumber();

    mResults->AddFrame( frame );
    ReportProgress( frame.mEndingSampleInclusive );
}